

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O0

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,read_partition_v4>
          (xr_reader *this,size_t n,
          vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_> *container,
          read_partition_v4 read)

{
  reference _part;
  value_type local_30;
  vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_> *local_28;
  vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_> *container_local;
  size_t n_local;
  xr_reader *this_local;
  read_partition_v4 read_local;
  
  local_28 = container;
  container_local = (vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_> *)n;
  n_local = (size_t)this;
  this_local = (xr_reader *)read.all_bones;
  std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::reserve
            (container,n);
  while (container_local !=
         (vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_> *)0x0) {
    local_30 = (value_type)0x0;
    container_local =
         (vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_> *)
         ((long)&container_local[-1].
                 super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::push_back
              (local_28,&local_30);
    _part = std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::back
                      (local_28);
    read_partition_v4::operator()((read_partition_v4 *)&this_local,_part,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}